

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.hpp
# Opt level: O0

void benchmarks::detail::BenchmarkInvoker<>::
     Invoke<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::function<void(benchmarks::BenchmarkContext&,long)>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,benchmarks::BenchmarkContext&,long&>
               (string *name,
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               paramNamesBegin,
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               paramNamesEnd,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *serializedParams,function<void_(benchmarks::BenchmarkContext_&,_long)> *f,
               BenchmarkContext *params,long *params_1)

{
  bool bVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  BenchmarkContext *local_38;
  BenchmarkContext *params_local;
  function<void_(benchmarks::BenchmarkContext_&,_long)> *f_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *serializedParams_local;
  string *name_local;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  paramNamesEnd_local;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  paramNamesBegin_local;
  
  local_38 = params;
  params_local = (BenchmarkContext *)f;
  f_local = (function<void_(benchmarks::BenchmarkContext_&,_long)> *)serializedParams;
  serializedParams_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)name;
  name_local = paramNamesEnd._M_current;
  paramNamesEnd_local = paramNamesBegin;
  bVar1 = __gnu_cxx::operator!=
                    (&paramNamesEnd_local,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&name_local);
  if (!bVar1) {
    std::function<void_(benchmarks::BenchmarkContext_&,_long)>::operator()
              ((function<void_(benchmarks::BenchmarkContext_&,_long)> *)params_local,local_38,
               *params_1);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 serializedParams_local,": parameters count mismatch!");
  std::runtime_error::runtime_error(this,(string *)&local_58);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void Invoke(const std::string& name, ParamNamesIter_ paramNamesBegin, ParamNamesIter_ paramNamesEnd, const SerializedParamsMap_& serializedParams, const Functor_& f, ParamTypes_&&... params)
			{
				if (paramNamesBegin != paramNamesEnd)
					throw std::runtime_error(name + ": parameters count mismatch!");

				f(std::forward<ParamTypes_>(params)...);
			}